

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

void __thiscall
miniscript::internal::InputResult::
InputResult<miniscript::internal::InputStack_const&,miniscript::internal::InputStack>
          (InputResult *this,InputStack *in_nsat,InputStack *in_sat)

{
  long lVar1;
  InputStack *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  InputStack::InputStack(in_RDI,(InputStack *)0x7decd8);
  InputStack::InputStack(in_RDI,(InputStack *)0x7decea);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

InputResult(A&& in_nsat, B&& in_sat) : nsat(std::forward<A>(in_nsat)), sat(std::forward<B>(in_sat)) {}